

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printDualSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  int iVar1;
  bool bVar2;
  Verbosity VVar3;
  int iVar4;
  element_type *peVar5;
  SPxOut *pSVar6;
  SPxOut *o;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Real __x;
  double dVar7;
  Verbosity old_verbosity_19;
  Verbosity old_verbosity_18;
  Verbosity old_verbosity_17;
  int i_5;
  Verbosity old_verbosity_16;
  VectorRational redcost_1;
  Verbosity old_verbosity_15;
  Verbosity old_verbosity_14;
  int i_4;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  int i_3;
  Verbosity old_verbosity_10;
  VectorRational dual_1;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  int i_2;
  Verbosity old_verbosity_6;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  redcost;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int i_1;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  Verbosity old_verbosity;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dual;
  int printwidth;
  int printprec;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff618;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff620;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff628;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffff630;
  SPxOut *in_stack_fffffffffffff668;
  SPxOut *in_stack_fffffffffffff670;
  SPxOut *in_stack_fffffffffffff678;
  double in_stack_fffffffffffff6b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6c0;
  Verbosity local_6b8;
  Verbosity local_6b4 [3];
  undefined1 local_6a8 [68];
  Verbosity local_664;
  Verbosity local_660 [2];
  undefined1 local_658 [68];
  int local_614;
  Verbosity local_610;
  Verbosity local_60c [7];
  Verbosity local_5f0;
  Verbosity local_5ec;
  undefined1 local_5e8 [68];
  Verbosity local_5a4;
  Verbosity local_5a0 [2];
  undefined1 local_598 [76];
  int local_54c;
  Verbosity local_548;
  Verbosity local_544 [3];
  undefined1 local_538 [76];
  int local_4ec;
  int local_4e8;
  Verbosity local_4e4;
  Verbosity local_4e0 [2];
  undefined1 local_4d8 [76];
  int local_48c;
  Verbosity local_488;
  Verbosity local_484 [8];
  Verbosity local_464;
  Verbosity local_460;
  int local_45c;
  int local_444;
  Verbosity local_440;
  Verbosity local_43c;
  undefined1 local_438 [80];
  int local_3e8;
  int local_3e4;
  Verbosity local_3e0;
  Verbosity local_3dc [6];
  undefined1 local_3c4 [80];
  int local_374;
  Verbosity local_370;
  Verbosity local_36c [8];
  int local_34c;
  int local_334;
  Verbosity local_330;
  Verbosity local_32c;
  undefined1 local_328 [80];
  int local_2d8;
  int local_2d4;
  Verbosity local_2d0;
  Verbosity local_2cc [5];
  undefined1 local_2b8 [80];
  int local_268;
  Verbosity local_264;
  Verbosity local_260;
  int local_25c;
  int local_244;
  Verbosity local_240;
  Verbosity local_23c;
  undefined1 local_238 [80];
  int local_1e8;
  int local_1e4;
  Verbosity local_1e0;
  Verbosity local_1dc [6];
  undefined1 local_1c4 [80];
  int local_174;
  Verbosity local_170;
  Verbosity local_16c [16];
  int local_12c;
  int local_128;
  byte local_122;
  byte local_121;
  long local_110;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_f8;
  undefined1 *local_f0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  Verbosity *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  Verbosity *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Verbosity *local_88;
  undefined1 *local_80;
  Verbosity *local_78;
  Verbosity *local_70;
  Verbosity *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_121 = in_CL & 1;
  local_122 = in_R8B & 1;
  local_110 = in_RDI;
  ::soplex::
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff618);
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x156caf);
  __x = ::soplex::Tolerances::epsilon(peVar5);
  dVar7 = log10(__x);
  local_128 = (int)-dVar7;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x156cff);
  local_12c = local_128 + 10;
  if ((local_121 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x156d2b);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff630,(int)((ulong)in_stack_fffffffffffff628 >> 0x20));
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getDualFarkas(in_stack_fffffffffffff628,
                            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffff620);
    if (bVar2) {
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_16c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_170 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_170);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_16c);
      }
      for (local_174 = 0; iVar1 = local_174,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x156e7e), iVar1 < iVar4; local_174 = local_174 + 1) {
        local_60 = ::soplex::
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff620,
                                (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
        local_58 = local_1c4;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff620,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff618);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff618);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x156f08);
        ::soplex::Tolerances::epsilon(peVar5);
        bVar2 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x156f47)
        ;
        if (((bVar2) && (local_110 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_1dc[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_1e0 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_1e0);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff620,
                     (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          local_1e4 = (int)std::setw(local_12c);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff618,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
          local_1e8 = (int)std::setprecision(local_128);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff618,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
          local_50 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff620,
                                  (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
          local_48 = local_238;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff620,
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_1dc);
        }
      }
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_23c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_240 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_240);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        local_244 = (int)std::setprecision(1);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff618,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff620,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff618);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff618);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x157280);
        ::soplex::Tolerances::epsilon(peVar5);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(double)in_stack_fffffffffffff618);
        local_25c = (int)std::setprecision(8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff618,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff620,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff618);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff620,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x157341)
        ;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_23c);
      }
    }
    else {
      bVar2 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isDualFeasible(in_stack_fffffffffffff620);
      if ((bVar2) &&
         (bVar2 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::getDual(in_stack_fffffffffffff628,
                            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffff620), bVar2)) {
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_260 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_264 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_264);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_260);
        }
        for (local_268 = 0; iVar1 = local_268,
            iVar4 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1574a6), iVar1 < iVar4; local_268 = local_268 + 1) {
          local_40 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff620,
                                  (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
          local_38 = local_2b8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff620,
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff618);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff618);
          peVar5 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x157530);
          ::soplex::Tolerances::epsilon(peVar5);
          bVar2 = ::soplex::
                  isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x15756f);
          if (((bVar2) && (local_110 != -8)) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_2cc[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_2d0 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_2d0);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff620,
                       (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
            local_2d4 = (int)std::setw(local_12c);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff618,
                       (_Setw)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
            local_2d8 = (int)std::setprecision(local_128);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff618,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
            local_30 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffff620,
                                    (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
            local_28 = local_328;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff620,
                       (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff618);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff618);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_2cc);
          }
        }
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_32c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_330 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_330);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          local_334 = (int)std::setprecision(1);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff618,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff618);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff618);
          peVar5 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1578a8);
          ::soplex::Tolerances::epsilon(peVar5);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(double)in_stack_fffffffffffff618);
          local_34c = (int)std::setprecision(8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff618,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x157969);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_32c);
        }
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x1579b9);
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff630,(int)((ulong)in_stack_fffffffffffff628 >> 0x20));
        bVar2 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRedCost(in_stack_fffffffffffff628,
                             (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff620);
        if (bVar2) {
          if ((local_110 != -8) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_36c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_370 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_370);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_36c);
          }
          for (local_374 = 0; iVar1 = local_374,
              iVar4 = ::soplex::
                      SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0x157aee), iVar1 < iVar4; local_374 = local_374 + 1) {
            local_20 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffff620,
                                    (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
            local_18 = local_3c4;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff620,
                       (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff618);
            ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances(in_stack_fffffffffffff618);
            peVar5 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x157b78);
            ::soplex::Tolerances::epsilon(peVar5);
            bVar2 = ::soplex::
                    isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                              (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x157bb7);
            if (((bVar2) && (local_110 != -8)) &&
               (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3))
            {
              local_3dc[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
              local_3e0 = INFO1;
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_3e0);
              ::soplex::NameSet::operator[]
                        ((NameSet *)in_stack_fffffffffffff620,
                         (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
              local_3e4 = (int)std::setw(local_12c);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff618,
                         (_Setw)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
              local_3e8 = (int)std::setprecision(local_128);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff618,
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
              local_10 = ::soplex::
                         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)in_stack_fffffffffffff620,
                                      (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
              local_8 = local_438;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff620,
                         (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff618);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff620,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff618);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff620,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_3dc);
            }
          }
          if ((local_110 != -8) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_43c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_440 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_440);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
            local_444 = (int)std::setprecision(1);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff618,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,
                       (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff618);
            ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances(in_stack_fffffffffffff618);
            peVar5 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x157ef0);
            ::soplex::Tolerances::epsilon(peVar5);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,(double)in_stack_fffffffffffff618);
            local_45c = (int)std::setprecision(8);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff618,
                       (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,
                       (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff618);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x157fb1);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_43c);
          }
        }
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x158000);
      }
      else if ((local_110 != -8) &&
              (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_460 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_464 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_464);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_460);
      }
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x1580cb);
  }
  if ((local_122 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x1580fa);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff630,(int)((ulong)in_stack_fffffffffffff628 >> 0x20));
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getDualFarkasRational
                      (in_stack_fffffffffffff628,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff620);
    if (bVar2) {
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_484[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_488 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_488);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_484);
      }
      for (local_48c = 0; iVar1 = local_48c,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x158227), iVar1 < iVar4; local_48c = local_48c + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff620,(int)((ulong)in_stack_fffffffffffff618 >> 0x20));
        local_4e0[1] = 0;
        local_c0 = local_4d8;
        local_c8 = local_4e0 + 1;
        local_d0 = 0;
        local_d8 = 0;
        local_68 = local_c8;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff678,(longlong *)in_stack_fffffffffffff670,
                   in_stack_fffffffffffff668);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff618,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1582ee);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x158304);
        if (((bVar2) && (local_110 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_4e0[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_4e4 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_4e4);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff620,
                     (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          local_4e8 = (int)std::setw(local_12c);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff618,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
          local_4ec = (int)std::setprecision(local_128);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff618,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff620 >> 0x20));
          local_108 = ::soplex::
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                    *)in_stack_fffffffffffff620,
                                   (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
          local_100 = local_538;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(in_stack_fffffffffffff630,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff628);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1584de);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_4e0);
        }
      }
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_544[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_544[1] = 3;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_544 + 1);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff620,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_544 + 2);
      }
    }
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isDualFeasible(in_stack_fffffffffffff620);
    if ((bVar2) &&
       (bVar2 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualRational(in_stack_fffffffffffff628,
                                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff620), bVar2)) {
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_544[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_548 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_548);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_544);
      }
      for (local_54c = 0; iVar1 = local_54c,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x158745), iVar1 < iVar4; local_54c = local_54c + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff620,(int)((ulong)in_stack_fffffffffffff618 >> 0x20));
        local_5a0[1] = 0;
        local_a0 = local_598;
        local_a8 = local_5a0 + 1;
        local_b0 = 0;
        local_b8 = 0;
        local_70 = local_a8;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff678,(longlong *)in_stack_fffffffffffff670,
                   in_stack_fffffffffffff668);
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff618,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x15880c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x158822);
        if (((bVar2) && (local_110 != -8)) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_5a0[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_5a4 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_5a4);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff620,
                     (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          in_stack_fffffffffffff678 =
               ::soplex::operator<<
                         ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          local_f8 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff620,
                                  (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
          local_f0 = local_5e8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor(in_stack_fffffffffffff630,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff628);
          in_stack_fffffffffffff670 =
               ::soplex::operator<<
                         ((SPxOut *)in_stack_fffffffffffff620,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)in_stack_fffffffffffff618);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x15897c);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_5a0);
        }
      }
      if ((local_110 != -8) &&
         (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
        local_5ec = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
        local_5f0 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_5f0);
        in_stack_fffffffffffff668 =
             ::soplex::operator<<
                       ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff620,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_5ec);
      }
      ::soplex::
      SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x158acb);
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff630,(int)((ulong)in_stack_fffffffffffff628 >> 0x20));
      bVar2 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostRational
                        (in_stack_fffffffffffff628,(VectorRational *)in_stack_fffffffffffff620);
      if (bVar2) {
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_60c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_610 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_610);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_60c);
        }
        for (local_614 = 0; iVar1 = local_614,
            iVar4 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x158bf1), iVar1 < iVar4; local_614 = local_614 + 1) {
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff620,(int)((ulong)in_stack_fffffffffffff618 >> 0x20))
          ;
          local_660[1] = 0;
          local_80 = local_658;
          local_88 = local_660 + 1;
          local_90 = 0;
          local_98 = 0;
          local_78 = local_88;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)in_stack_fffffffffffff678,(longlong *)in_stack_fffffffffffff670,
                     in_stack_fffffffffffff668);
          bVar2 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)in_stack_fffffffffffff618,
                             (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)0x158ca9);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x158cbc);
          if (((bVar2) && (local_110 != -8)) &&
             (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
            local_660[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
            local_664 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_664);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff620,
                       (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
            pSVar6 = ::soplex::operator<<
                               ((SPxOut *)in_stack_fffffffffffff620,
                                (char *)in_stack_fffffffffffff618);
            o = ::soplex::operator<<
                          ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
            local_e8 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff620,
                                    (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
            local_e0 = local_6a8;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)pSVar6,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)o);
            in_stack_fffffffffffff620 =
                 (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)::soplex::operator<<
                              ((SPxOut *)in_stack_fffffffffffff620,
                               (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)in_stack_fffffffffffff618);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff620,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff618);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x158e13);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_660);
          }
        }
        if ((local_110 != -8) &&
           (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
          local_6b4[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
          local_6b4[1] = 3;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_6b4 + 1);
          pSVar6 = ::soplex::operator<<
                             ((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618)
          ;
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff620,(_func_ostream_ptr_ostream_ptr *)pSVar6);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_6b4 + 2);
        }
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)0x158f62);
    }
    else if ((local_110 != -8) &&
            (VVar3 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8)), 2 < (int)VVar3)) {
      local_6b4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_110 + 8));
      local_6b8 = INFO1;
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),&local_6b8);
      ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff620,(char *)in_stack_fffffffffffff618);
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_110 + 8),local_6b4);
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x15902b);
  }
  return;
}

Assistant:

static
void printDualSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                       bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                                << std::setw(printwidth) << std::setprecision(printprec)
                                << redcost[i] << std::endl;)
               }
            }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero (within "
                          << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                          << std::setprecision(8) << std::fixed << ")." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual information available.\n")
      }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth)
                             << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t" << dual[i] << std::endl;)
            }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero." << std::endl;)

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << redcost[i] << std::endl;)
               }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual (rational) solution available.\n")
      }
}